

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnLocalDecl
          (BinaryReaderLogging *this,Index decl_index,Index count,Type type)

{
  Enum EVar1;
  char *pcVar2;
  
  WriteIndent(this);
  if (type < Anyfunc) {
    if (type == Void) {
      pcVar2 = "void";
      goto LAB_00f4f93f;
    }
    if (type == Func) {
      pcVar2 = "func";
      goto LAB_00f4f93f;
    }
    if (type == ExceptRef) {
      pcVar2 = "except_ref";
      goto LAB_00f4f93f;
    }
switchD_00f4f8cd_caseD_fffffff1:
    pcVar2 = "<type index>";
  }
  else {
    switch(type) {
    case Any:
      pcVar2 = "any";
      break;
    case Anyfunc:
      pcVar2 = "anyfunc";
      break;
    default:
      goto switchD_00f4f8cd_caseD_fffffff1;
    case V128:
      pcVar2 = "v128";
      break;
    case F64:
      pcVar2 = "f64";
      break;
    case F32:
      pcVar2 = "f32";
      break;
    case I64:
      pcVar2 = "i64";
      break;
    case I32:
      pcVar2 = "i32";
    }
  }
LAB_00f4f93f:
  Stream::Writef(this->stream_,"OnLocalDecl(index: %u, count: %u, type: %s)\n",(ulong)decl_index,
                 (ulong)count,pcVar2);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x34])
                    (this->reader_,(ulong)decl_index,(ulong)count,(ulong)(uint)type);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnLocalDecl(Index decl_index,
                                        Index count,
                                        Type type) {
  LOGF("OnLocalDecl(index: %" PRIindex ", count: %" PRIindex ", type: %s)\n",
       decl_index, count, GetTypeName(type));
  return reader_->OnLocalDecl(decl_index, count, type);
}